

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_color.cxx
# Opt level: O0

void Fl::get_color(Fl_Color i,uchar *red,uchar *green,uchar *blue)

{
  uint local_2c;
  uint c;
  uchar *blue_local;
  uchar *green_local;
  uchar *red_local;
  Fl_Color i_local;
  
  local_2c = i;
  if ((i & 0xffffff00) == 0) {
    local_2c = fl_cmap[i];
  }
  *red = (uchar)(local_2c >> 0x18);
  *green = (uchar)(local_2c >> 0x10);
  *blue = (uchar)(local_2c >> 8);
  return;
}

Assistant:

void Fl::get_color(Fl_Color i, uchar &red, uchar &green, uchar &blue) {
  unsigned c;

  if (i & 0xffffff00) c = (unsigned)i;
  else c = fl_cmap[i];

  red   = uchar(c>>24);
  green = uchar(c>>16);
  blue  = uchar(c>>8);
}